

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
IgnoredUtestShell::runOneTest(IgnoredUtestShell *this,TestPlugin *plugin,TestResult *result)

{
  long *in_RDX;
  TestResult *in_RSI;
  TestPlugin *in_RDI;
  UtestShell *unaff_retaddr;
  
  if (((ulong)in_RDI[1].next_ & 0x10000) == 0) {
    (**(code **)(*in_RDX + 0x60))();
  }
  else {
    UtestShell::runOneTest(unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void IgnoredUtestShell::runOneTest(TestPlugin* plugin, TestResult& result)
{
    if (runIgnored_)
    {
        UtestShell::runOneTest(plugin, result);
        return;
    }

    result.countIgnored();
}